

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O0

void __thiscall Inject::ctor_inject::ctor_inject(ctor_inject *this,type *service1)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *prev;
  type psVar4;
  undefined4 extraout_var;
  unique_id local_90;
  undefined8 local_88 [3];
  basic_cstring<const_char> local_70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_60;
  basic_cstring<const_char> local_38;
  basic_cstring<const_char> local_28;
  type *local_18;
  type *service1_local;
  ctor_inject *this_local;
  
  this->ctor_num = 1;
  local_18 = service1;
  service1_local = (type *)this;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_38);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_28,0x247,&local_38);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_60,prev,(char (*) [1])0x19674c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
               ,0x65);
    psVar4 = boost::shared_ptr<Inject::service>::operator->(service1);
    iVar3 = (**psVar4->_vptr_service)();
    local_88[0] = CONCAT44(extraout_var,iVar3);
    local_90 = inject::id_of<Inject::impl1>::id();
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_60,&local_70,0x247,1,2,local_88,"service1->id()",&local_90,
               "id_of<impl1>::id()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_60);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1) {
        ctor_num = 1;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
    }